

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator(cmGhsMultiTargetGenerator *this)

{
  ~cmGhsMultiTargetGenerator(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator() = default;